

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

void __thiscall HighFreqDataType::HighFreqDataType(HighFreqDataType *this)

{
  (this->super_NetworkDataType)._vptr_NetworkDataType =
       (_func_int **)&PTR__HighFreqDataType_003ebdf8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->origin)._M_dataplus._M_p = (pointer)&(this->origin).field_2;
  (this->origin)._M_string_length = 0;
  (this->origin).field_2._M_local_buf[0] = '\0';
  (this->dataFormat)._M_dataplus._M_p = (pointer)&(this->dataFormat).field_2;
  (this->dataFormat)._M_string_length = 0;
  (this->dataFormat).field_2._M_local_buf[0] = '\0';
  (this->sockAddr)._M_dataplus._M_p = (pointer)&(this->sockAddr).field_2;
  (this->sockAddr)._M_string_length = 0;
  (this->sockAddr).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->name,0,(char *)0x0,0x360c54);
  std::__cxx11::string::_M_replace
            ((ulong)&this->origin,0,(char *)(this->origin)._M_string_length,0x360c54);
  std::__cxx11::string::_M_replace
            ((ulong)&this->dataFormat,0,(char *)(this->dataFormat)._M_string_length,0x360c54);
  std::__cxx11::string::_M_replace
            ((ulong)&this->sockAddr,0,(char *)(this->sockAddr)._M_string_length,0x360c54);
  this->byteSize = 0;
  return;
}

Assistant:

HighFreqDataType::HighFreqDataType() : NetworkDataType() {
    name = "";
    origin = "";
    dataFormat = "";
    sockAddr = "";
    byteSize = 0;
}